

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LogToFile(int max_depth,char *filename)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  FILE *pFVar3;
  
  pIVar2 = GImGui;
  if ((GImGui->LogEnabled == false) &&
     ((pIVar1 = GImGui->CurrentWindow, filename != (char *)0x0 ||
      (filename = (GImGui->IO).LogFilename, filename != (char *)0x0)))) {
    if (GImGui->LogFile != (FILE *)0x0) {
      __assert_fail("g.LogFile == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x1f64,"void ImGui::LogToFile(int, const char *)");
    }
    pFVar3 = fopen(filename,"ab");
    pIVar2->LogFile = (FILE *)pFVar3;
    if (pFVar3 == (FILE *)0x0) {
      __assert_fail("g.LogFile != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x1f68,"void ImGui::LogToFile(int, const char *)");
    }
    pIVar2->LogEnabled = true;
    pIVar2->LogStartDepth = (pIVar1->DC).TreeDepth;
    if (-1 < max_depth) {
      pIVar2->LogAutoExpandMaxDepth = max_depth;
    }
  }
  return;
}

Assistant:

void ImGui::LogToFile(int max_depth, const char* filename)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;
    ImGuiWindow* window = g.CurrentWindow;

    if (!filename)
    {
        filename = g.IO.LogFilename;
        if (!filename)
            return;
    }

    IM_ASSERT(g.LogFile == NULL);
    g.LogFile = ImFileOpen(filename, "ab");
    if (!g.LogFile)
    {
        IM_ASSERT(g.LogFile != NULL); // Consider this an error
        return;
    }
    g.LogEnabled = true;
    g.LogStartDepth = window->DC.TreeDepth;
    if (max_depth >= 0)
        g.LogAutoExpandMaxDepth = max_depth;
}